

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  __m256i vWH_00;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  long lVar40;
  uint in_ECX;
  int iVar41;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar42 [32];
  long in_stack_00000008;
  int32_t k;
  int32_t *j_1;
  int32_t *i_1;
  int32_t *t;
  __m256i cond_Jlt;
  __m256i cond_all;
  __m256i cond_max;
  __m256i cond_eq;
  __m256i cond_valid_IJ;
  __m256i cond_valid_J;
  __m256i cond;
  __m256i vNWH;
  __m256i vMat;
  __m256i vIltLimit;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vJ;
  __m256i vF;
  __m256i vE;
  __m256i vWH;
  __m256i vNH;
  __m256i vJLimit;
  __m256i vILimit;
  __m256i vEndJ;
  __m256i vEndI;
  __m256i vMaxH;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vN;
  __m256i vOne;
  __m256i vZero;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf0;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int32_t *F_pr;
  int32_t *H_pr;
  int32_t *s2;
  int32_t *_F_pr;
  int32_t *_H_pr;
  int32_t *s2B;
  int32_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int in_stack_ffffffffffffead0;
  int32_t i_00;
  long lVar43;
  undefined4 in_stack_ffffffffffffeae0;
  int iVar44;
  int in_stack_ffffffffffffeae8;
  int32_t iVar45;
  long lVar46;
  int in_stack_ffffffffffffeb00;
  int32_t iVar47;
  int local_14e8;
  int local_14e4;
  int local_14d0;
  int local_14cc;
  int local_14b8;
  int local_14b4;
  int local_14a0;
  int local_149c;
  int local_1488;
  int local_1484;
  int local_1444;
  uint local_1440;
  int local_143c;
  int *local_1438;
  int *local_1430;
  uint *local_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [24];
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [24];
  undefined8 uStack_1228;
  undefined1 local_1220 [32];
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 local_1140 [32];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined1 local_1060 [32];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  uint local_f94;
  uint local_f90;
  uint local_f8c;
  int local_f88;
  int local_f84;
  uint local_f80;
  uint local_f7c;
  parasail_result_t *local_f78;
  int32_t *local_f70;
  int32_t *local_f68;
  int32_t *local_f60;
  int32_t *local_f58;
  int32_t *local_f50;
  int32_t *local_f48;
  int32_t *local_f40;
  int local_f34;
  int local_f30;
  uint local_f2c;
  int local_f28;
  int local_f24;
  int local_f20;
  uint local_f14;
  long local_f10;
  long local_f00;
  parasail_result_t *local_ef8;
  uint local_ee8;
  undefined4 local_ee4;
  undefined4 local_ee0;
  undefined4 local_edc;
  undefined4 local_ed8;
  uint local_ecc;
  uint local_ec8;
  uint local_ec4;
  undefined1 local_ec0 [32];
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined1 local_de0 [32];
  undefined1 local_dc0 [16];
  undefined1 auStack_db0 [16];
  uint local_da0;
  uint local_d9c;
  uint local_d98;
  uint local_d94;
  uint local_d90;
  uint local_d8c;
  uint local_d88;
  uint local_d84;
  undefined1 local_d80 [16];
  undefined1 auStack_d70 [16];
  uint local_d60;
  uint local_d5c;
  uint local_d58;
  uint local_d54;
  uint local_d50;
  uint local_d4c;
  uint local_d48;
  uint local_d44;
  undefined1 local_d40 [16];
  undefined1 auStack_d30 [16];
  uint local_d20;
  uint local_d1c;
  uint local_d18;
  uint local_d14;
  uint local_d10;
  uint local_d0c;
  uint local_d08;
  uint local_d04;
  undefined1 local_d00 [16];
  undefined1 auStack_cf0 [16];
  undefined1 local_cc0 [16];
  undefined1 auStack_cb0 [16];
  undefined1 local_c80 [16];
  undefined1 auStack_c70 [16];
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined4 local_c54;
  undefined4 local_c50;
  undefined4 local_c4c;
  undefined4 local_c48;
  undefined4 local_c44;
  undefined1 local_c40 [16];
  undefined1 auStack_c30 [16];
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined4 local_c08;
  undefined4 local_c04;
  undefined1 local_c00 [16];
  undefined1 auStack_bf0 [16];
  undefined4 local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 local_bd0;
  undefined4 local_bcc;
  undefined4 local_bc8;
  undefined4 local_bc4;
  undefined1 local_bc0 [16];
  undefined1 auStack_bb0 [16];
  undefined4 local_ba0;
  undefined4 local_b9c;
  undefined4 local_b98;
  undefined4 local_b94;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined1 local_b80 [16];
  undefined1 auStack_b70 [16];
  uint local_b60;
  uint local_b5c;
  uint local_b58;
  uint local_b54;
  uint local_b50;
  uint local_b4c;
  uint local_b48;
  uint local_b44;
  undefined1 local_b40 [32];
  undefined1 local_b00 [16];
  undefined1 auStack_af0 [16];
  uint local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  uint local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined1 local_ac0 [16];
  undefined1 auStack_ab0 [16];
  undefined4 local_aa0;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  undefined4 local_a8c;
  undefined4 local_a88;
  undefined4 local_a84;
  undefined1 local_a80 [16];
  undefined1 auStack_a70 [16];
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_920 [16];
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  local_f20 = 0;
  local_f24 = 0;
  local_f28 = 0;
  local_f2c = 0;
  local_f30 = 0;
  local_f34 = 0;
  local_f40 = (int32_t *)0x0;
  local_f48 = (int32_t *)0x0;
  local_f50 = (int32_t *)0x0;
  local_f58 = (int32_t *)0x0;
  local_f60 = (int32_t *)0x0;
  local_f68 = (int32_t *)0x0;
  local_f70 = (int32_t *)0x0;
  local_f78 = (parasail_result_t *)0x0;
  local_f7c = 0;
  local_f80 = 0;
  local_f84 = 0;
  local_f88 = 0;
  local_f8c = 0;
  local_f90 = 0;
  local_f94 = 0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_diag_avx2_256_32","_s2");
    local_ef8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_diag_avx2_256_32","s2Len");
    local_ef8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_diag_avx2_256_32","open");
    local_ef8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_diag_avx2_256_32","gap");
    local_ef8 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_diag_avx2_256_32","matrix");
    local_ef8 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 0) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_diag_avx2_256_32","_s1");
        return (parasail_result_t *)0x0;
      }
      if ((int)in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_diag_avx2_256_32","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_f20 = 8;
    local_f24 = 7;
    local_f28 = 0xe;
    local_1440 = in_ESI;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      local_1440 = *(uint *)(in_stack_00000008 + 0x34);
    }
    local_f2c = local_1440;
    local_f30 = local_1440 + 7;
    local_f34 = in_ECX + 7;
    local_f7c = 0;
    local_f80 = 0;
    local_f84 = 0;
    local_f88 = 0;
    if ((int)-in_R8D < *(int *)(in_stack_00000008 + 0x20)) {
      local_1444 = in_R8D + 0x80000000;
    }
    else {
      local_1444 = -0x80000000 - *(int *)(in_stack_00000008 + 0x20);
    }
    local_f94 = local_1444 + 1;
    local_f90 = 0x7ffffffe - *(int *)(in_stack_00000008 + 0x1c);
    auVar13 = vpinsrd_avx(ZEXT416(local_f94),local_f94,1);
    auVar13 = vpinsrd_avx(auVar13,local_f94,2);
    local_dc0 = vpinsrd_avx(auVar13,local_f94,3);
    auVar13 = vpinsrd_avx(ZEXT416(local_f94),local_f94,1);
    auVar13 = vpinsrd_avx(auVar13,local_f94,2);
    auStack_db0 = vpinsrd_avx(auVar13,local_f94,3);
    local_fc0 = local_dc0._0_8_;
    uStack_fb8 = local_dc0._8_8_;
    uStack_fb0 = auStack_db0._0_8_;
    uStack_fa8 = auStack_db0._8_8_;
    auVar13 = vpinsrd_avx(ZEXT416(local_f90),local_f90,1);
    auVar13 = vpinsrd_avx(auVar13,local_f90,2);
    local_d80 = vpinsrd_avx(auVar13,local_f90,3);
    auVar13 = vpinsrd_avx(ZEXT416(local_f90),local_f90,1);
    auVar13 = vpinsrd_avx(auVar13,local_f90,2);
    auStack_d70 = vpinsrd_avx(auVar13,local_f90,3);
    local_fe0 = local_d80._0_8_;
    uStack_fd8 = local_d80._8_8_;
    uStack_fd0 = auStack_d70._0_8_;
    uStack_fc8 = auStack_d70._8_8_;
    local_1000._16_8_ = auStack_d70._0_8_;
    local_1000._0_16_ = local_d80;
    local_1000._24_8_ = auStack_d70._8_8_;
    local_1020._16_8_ = auStack_db0._0_8_;
    local_1020._0_16_ = local_dc0;
    local_1020._24_8_ = auStack_db0._8_8_;
    auVar13 = vpinsrd_avx(ZEXT416(local_f94),local_f94,1);
    auVar13 = vpinsrd_avx(auVar13,local_f94,2);
    local_d40 = vpinsrd_avx(auVar13,local_f94,3);
    auVar13 = vpinsrd_avx(ZEXT416(local_f94),local_f94,1);
    auVar13 = vpinsrd_avx(auVar13,local_f94,2);
    auStack_d30 = vpinsrd_avx(auVar13,local_f94,3);
    local_1040 = local_d40._0_8_;
    uStack_1038 = local_d40._8_8_;
    uStack_1030 = auStack_d30._0_8_;
    uStack_1028 = auStack_d30._8_8_;
    auVar18._16_8_ = auStack_d30._0_8_;
    auVar18._0_16_ = local_d40;
    auVar18._24_8_ = auStack_d30._8_8_;
    local_de0 = vpslldq_avx2(ZEXT1632(auStack_d30),0xc);
    local_e00 = vpsrldq_avx2(auVar18,4);
    local_1060 = vpor_avx2(local_de0,local_e00);
    auVar13 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar13 = vpinsrd_avx(auVar13,in_R8D,2);
    local_d00 = vpinsrd_avx(auVar13,in_R8D,3);
    auVar13 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar13 = vpinsrd_avx(auVar13,in_R8D,2);
    auStack_cf0 = vpinsrd_avx(auVar13,in_R8D,3);
    local_1080 = local_d00._0_8_;
    uStack_1078 = local_d00._8_8_;
    uStack_1070 = auStack_cf0._0_8_;
    uStack_1068 = auStack_cf0._8_8_;
    auVar13 = vpinsrd_avx(ZEXT416(in_R9D),in_R9D,1);
    auVar13 = vpinsrd_avx(auVar13,in_R9D,2);
    local_cc0 = vpinsrd_avx(auVar13,in_R9D,3);
    auVar13 = vpinsrd_avx(ZEXT416(in_R9D),in_R9D,1);
    auVar13 = vpinsrd_avx(auVar13,in_R9D,2);
    auStack_cb0 = vpinsrd_avx(auVar13,in_R9D,3);
    local_10a0 = local_cc0._0_8_;
    uStack_1098 = local_cc0._8_8_;
    uStack_1090 = auStack_cb0._0_8_;
    uStack_1088 = auStack_cb0._8_8_;
    local_ed8 = 0;
    local_c44 = 0;
    local_c48 = 0;
    local_c4c = 0;
    local_c50 = 0;
    local_c54 = 0;
    local_c58 = 0;
    local_c5c = 0;
    local_c60 = 0;
    auVar13 = vpinsrd_avx(ZEXT416(0),0,1);
    auVar13 = vpinsrd_avx(auVar13,0,2);
    local_c80 = vpinsrd_avx(auVar13,0,3);
    auVar13 = vpinsrd_avx(ZEXT416(0),0,1);
    auVar13 = vpinsrd_avx(auVar13,0,2);
    auStack_c70 = vpinsrd_avx(auVar13,0,3);
    local_10c0 = local_c80._0_8_;
    uStack_10b8 = local_c80._8_8_;
    uStack_10b0 = auStack_c70._0_8_;
    uStack_10a8 = auStack_c70._8_8_;
    local_edc = 1;
    local_c04 = 1;
    local_c08 = 1;
    local_c0c = 1;
    local_c10 = 1;
    local_c14 = 1;
    local_c18 = 1;
    local_c1c = 1;
    local_c20 = 1;
    auVar13 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar13 = vpinsrd_avx(auVar13,1,2);
    local_c40 = vpinsrd_avx(auVar13,1,3);
    auVar13 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar13 = vpinsrd_avx(auVar13,1,2);
    auStack_c30 = vpinsrd_avx(auVar13,1,3);
    local_10e0 = local_c40._0_8_;
    uStack_10d8 = local_c40._8_8_;
    uStack_10d0 = auStack_c30._0_8_;
    uStack_10c8 = auStack_c30._8_8_;
    local_ee0 = 8;
    local_bc4 = 8;
    local_bc8 = 8;
    local_bcc = 8;
    local_bd0 = 8;
    local_bd4 = 8;
    local_bd8 = 8;
    local_bdc = 8;
    local_be0 = 8;
    auVar13 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar13 = vpinsrd_avx(auVar13,8,2);
    local_c00 = vpinsrd_avx(auVar13,8,3);
    auVar13 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar13 = vpinsrd_avx(auVar13,8,2);
    auStack_bf0 = vpinsrd_avx(auVar13,8,3);
    local_1100 = local_c00._0_8_;
    uStack_10f8 = local_c00._8_8_;
    uStack_10f0 = auStack_bf0._0_8_;
    uStack_10e8 = auStack_bf0._8_8_;
    local_ee4 = 0xffffffff;
    local_b84 = 0xffffffff;
    local_b88 = 0xffffffff;
    local_b8c = 0xffffffff;
    local_b90 = 0xffffffff;
    local_b94 = 0xffffffff;
    local_b98 = 0xffffffff;
    local_b9c = 0xffffffff;
    local_ba0 = 0xffffffff;
    auVar13 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
    auVar13 = vpinsrd_avx(auVar13,0xffffffff,2);
    local_bc0 = vpinsrd_avx(auVar13,0xffffffff,3);
    auVar13 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
    auVar13 = vpinsrd_avx(auVar13,0xffffffff,2);
    auStack_bb0 = vpinsrd_avx(auVar13,0xffffffff,3);
    local_1120 = local_bc0._0_8_;
    uStack_1118 = local_bc0._8_8_;
    uStack_1110 = auStack_bb0._0_8_;
    uStack_1108 = auStack_bb0._8_8_;
    local_a44 = 0;
    local_a48 = 1;
    local_a4c = 2;
    local_a50 = 3;
    local_a54 = 4;
    local_a58 = 5;
    local_a5c = 6;
    local_a60 = 7;
    auVar13 = vpinsrd_avx(ZEXT416(7),6,1);
    auVar13 = vpinsrd_avx(auVar13,5,2);
    local_a80 = vpinsrd_avx(auVar13,4,3);
    auVar13 = vpinsrd_avx(ZEXT416(3),2,1);
    auVar13 = vpinsrd_avx(auVar13,1,2);
    auStack_a70 = vpinsrd_avx(auVar13,0,3);
    local_1140._16_8_ = auStack_a70._0_8_;
    local_1140._0_16_ = local_a80;
    local_1140._24_8_ = auStack_a70._8_8_;
    local_a84 = 0;
    local_a88 = 0xffffffff;
    local_a8c = 0xfffffffe;
    local_a90 = 0xfffffffd;
    local_a94 = 0xfffffffc;
    local_a98 = 0xfffffffb;
    local_a9c = 0xfffffffa;
    local_aa0 = 0xfffffff9;
    auVar13 = vpinsrd_avx(ZEXT416(0xfffffff9),0xfffffffa,1);
    auVar13 = vpinsrd_avx(auVar13,0xfffffffb,2);
    local_ac0 = vpinsrd_avx(auVar13,0xfffffffc,3);
    auVar13 = vpinsrd_avx(ZEXT416(0xfffffffd),0xfffffffe,1);
    auVar13 = vpinsrd_avx(auVar13,0xffffffff,2);
    auStack_ab0 = vpinsrd_avx(auVar13,0,3);
    local_1160 = local_ac0._0_8_;
    uStack_1158 = local_ac0._8_8_;
    uStack_1150 = auStack_ab0._0_8_;
    uStack_1148 = auStack_ab0._8_8_;
    local_1180._16_8_ = auStack_d30._0_8_;
    local_1180._0_16_ = local_d40;
    local_1180._24_8_ = auStack_d30._8_8_;
    local_11a0._16_8_ = auStack_d30._0_8_;
    local_11a0._0_16_ = local_d40;
    local_11a0._24_8_ = auStack_d30._8_8_;
    local_11c0._16_8_ = auStack_d30._0_8_;
    local_11c0._0_16_ = local_d40;
    local_11c0._24_8_ = auStack_d30._8_8_;
    local_ee8 = local_1440;
    local_b44 = local_1440;
    local_b48 = local_1440;
    local_b4c = local_1440;
    local_b50 = local_1440;
    local_b54 = local_1440;
    local_b58 = local_1440;
    local_b5c = local_1440;
    local_b60 = local_1440;
    auVar13 = vpinsrd_avx(ZEXT416(local_1440),local_1440,1);
    auVar13 = vpinsrd_avx(auVar13,local_1440,2);
    auVar13 = vpinsrd_avx(auVar13,local_1440,3);
    auVar14 = vpinsrd_avx(ZEXT416(local_1440),local_1440,1);
    auVar14 = vpinsrd_avx(auVar14,local_1440,2);
    auStack_b70 = vpinsrd_avx(auVar14,local_1440,3);
    local_b80._0_8_ = auVar13._0_8_;
    uVar36 = local_b80._0_8_;
    local_b80._8_8_ = auVar13._8_8_;
    uVar37 = local_b80._8_8_;
    uVar38 = auStack_b70._0_8_;
    uVar39 = auStack_b70._8_8_;
    auVar14 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar14 = vpinsrd_avx(auVar14,in_ECX,2);
    auVar14 = vpinsrd_avx(auVar14,in_ECX,3);
    auVar15 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar15 = vpinsrd_avx(auVar15,in_ECX,2);
    auVar15 = vpinsrd_avx(auVar15,in_ECX,3);
    auVar42._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar15;
    auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
    local_f8c = local_f94;
    local_f14 = in_ECX;
    local_f10 = in_RDX;
    local_f00 = in_RDI;
    local_ecc = local_f94;
    local_ec8 = local_f90;
    local_ec4 = local_f94;
    local_da0 = local_f94;
    local_d9c = local_f94;
    local_d98 = local_f94;
    local_d94 = local_f94;
    local_d90 = local_f94;
    local_d8c = local_f94;
    local_d88 = local_f94;
    local_d84 = local_f94;
    local_d60 = local_f90;
    local_d5c = local_f90;
    local_d58 = local_f90;
    local_d54 = local_f90;
    local_d50 = local_f90;
    local_d4c = local_f90;
    local_d48 = local_f90;
    local_d44 = local_f90;
    local_d20 = local_f94;
    local_d1c = local_f94;
    local_d18 = local_f94;
    local_d14 = local_f94;
    local_d10 = local_f94;
    local_d0c = local_f94;
    local_d08 = local_f94;
    local_d04 = local_f94;
    local_b80 = auVar13;
    local_b40 = auVar42;
    local_f78 = parasail_result_new_table1(local_1440,in_ECX);
    if (local_f78 == (parasail_result_t *)0x0) {
      local_ef8 = (parasail_result_t *)0x0;
    }
    else {
      local_f78->flag = local_f78->flag | 0x8401004;
      local_f78->flag = local_f78->flag | 0x20000;
      local_f48 = parasail_memalign_int32_t(0x20,(long)(int)(local_f14 + local_f28));
      local_f50 = parasail_memalign_int32_t(0x20,(long)(int)(local_f14 + local_f28));
      local_f58 = parasail_memalign_int32_t(0x20,(long)(int)(local_f14 + local_f28));
      local_f60 = local_f48 + local_f24;
      local_f68 = local_f50 + local_f24;
      local_f70 = local_f58 + local_f24;
      if (local_f48 == (int32_t *)0x0) {
        local_ef8 = (parasail_result_t *)0x0;
      }
      else if (local_f50 == (int32_t *)0x0) {
        local_ef8 = (parasail_result_t *)0x0;
      }
      else if (local_f58 == (int32_t *)0x0) {
        local_ef8 = (parasail_result_t *)0x0;
      }
      else {
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          local_f40 = parasail_memalign_int32_t(0x20,(long)(int)(local_f2c + local_f24));
          if (local_f40 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_f7c = 0; (int)local_f7c < (int)local_f2c; local_f7c = local_f7c + 1) {
            local_f40[(int)local_f7c] =
                 *(int32_t *)
                  (*(long *)(in_stack_00000008 + 0x10) +
                  (ulong)*(byte *)(local_f00 + (int)local_f7c) * 4);
          }
          for (local_f7c = local_f2c; (int)local_f7c < local_f30; local_f7c = local_f7c + 1) {
            local_f40[(int)local_f7c] = 0;
          }
        }
        for (local_f80 = 0; (int)local_f80 < (int)local_f14; local_f80 = local_f80 + 1) {
          local_f60[(int)local_f80] =
               *(int32_t *)
                (*(long *)(in_stack_00000008 + 0x10) +
                (ulong)*(byte *)(local_f10 + (int)local_f80) * 4);
        }
        for (local_f80 = -local_f24; (int)local_f80 < 0; local_f80 = local_f80 + 1) {
          local_f60[(int)local_f80] = 0;
        }
        for (local_f80 = local_f14; (int)local_f80 < local_f34; local_f80 = local_f80 + 1) {
          local_f60[(int)local_f80] = 0;
        }
        for (local_f80 = 0; (int)local_f80 < (int)local_f14; local_f80 = local_f80 + 1) {
          local_f68[(int)local_f80] = 0;
          local_f70[(int)local_f80] = local_f8c;
        }
        for (local_f80 = -local_f24; (int)local_f80 < 0; local_f80 = local_f80 + 1) {
          local_f68[(int)local_f80] = local_f8c;
          local_f70[(int)local_f80] = local_f8c;
        }
        for (local_f80 = local_f14; (int)local_f80 < (int)(local_f14 + local_f24);
            local_f80 = local_f80 + 1) {
          local_f68[(int)local_f80] = local_f8c;
          local_f70[(int)local_f80] = local_f8c;
        }
        for (local_f7c = 0; (int)local_f7c < (int)local_f2c; local_f7c = local_f20 + local_f7c) {
          local_1220 = local_1060;
          _local_1240 = local_1060;
          local_1260._8_8_ = uStack_1038;
          local_1260._0_8_ = local_1040;
          local_1260._16_8_ = uStack_1030;
          local_1260._24_8_ = uStack_1028;
          local_1280._8_8_ = uStack_1038;
          local_1280._0_8_ = local_1040;
          local_1280._16_8_ = uStack_1030;
          uStack_1268 = uStack_1028;
          local_12a0._8_8_ = uStack_1158;
          local_12a0._0_8_ = local_1160;
          local_12a0._16_8_ = uStack_1150;
          local_12a0._24_8_ = uStack_1148;
          lVar7 = *(long *)(in_stack_00000008 + 8);
          iVar2 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1484 = local_f40[(int)local_f7c];
          }
          else {
            if ((int)local_f7c < (int)local_f2c) {
              local_1488 = local_f7c;
            }
            else {
              local_1488 = local_f2c - 1;
            }
            local_1484 = local_1488;
          }
          lVar8 = *(long *)(in_stack_00000008 + 8);
          iVar3 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_149c = local_f40[(int)(local_f7c + 1)];
          }
          else {
            if ((int)(local_f7c + 1) < (int)local_f2c) {
              local_14a0 = local_f7c + 1;
            }
            else {
              local_14a0 = local_f2c - 1;
            }
            local_149c = local_14a0;
          }
          lVar9 = *(long *)(in_stack_00000008 + 8);
          iVar4 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14b4 = local_f40[(int)(local_f7c + 2)];
          }
          else {
            if ((int)(local_f7c + 2) < (int)local_f2c) {
              local_14b8 = local_f7c + 2;
            }
            else {
              local_14b8 = local_f2c - 1;
            }
            local_14b4 = local_14b8;
          }
          lVar10 = *(long *)(in_stack_00000008 + 8);
          iVar5 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14cc = local_f40[(int)(local_f7c + 3)];
          }
          else {
            if ((int)(local_f7c + 3) < (int)local_f2c) {
              local_14d0 = local_f7c + 3;
            }
            else {
              local_14d0 = local_f2c - 1;
            }
            local_14cc = local_14d0;
          }
          lVar11 = *(long *)(in_stack_00000008 + 8);
          iVar6 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14e4 = local_f40[(int)(local_f7c + 4)];
          }
          else {
            if ((int)(local_f7c + 4) < (int)local_f2c) {
              local_14e8 = local_f7c + 4;
            }
            else {
              local_14e8 = local_f2c - 1;
            }
            local_14e4 = local_14e8;
          }
          lVar12 = *(long *)(in_stack_00000008 + 8);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar47 = local_f40[(int)(local_f7c + 5)];
          }
          else if ((int)(local_f7c + 5) < (int)local_f2c) {
            in_stack_ffffffffffffeb00 = local_f7c + 5;
            iVar47 = in_stack_ffffffffffffeb00;
          }
          else {
            in_stack_ffffffffffffeb00 = local_f2c - 1;
            iVar47 = in_stack_ffffffffffffeb00;
          }
          iVar41 = *(int *)(in_stack_00000008 + 0x18) * iVar47;
          lVar46 = *(long *)(in_stack_00000008 + 8);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar45 = local_f40[(int)(local_f7c + 6)];
          }
          else if ((int)(local_f7c + 6) < (int)local_f2c) {
            in_stack_ffffffffffffeae8 = local_f7c + 6;
            iVar45 = in_stack_ffffffffffffeae8;
          }
          else {
            in_stack_ffffffffffffeae8 = local_f2c - 1;
            iVar45 = in_stack_ffffffffffffeae8;
          }
          lVar40 = lVar46 + (long)(*(int *)(in_stack_00000008 + 0x18) * iVar45) * 4;
          lVar43 = *(long *)(in_stack_00000008 + 8);
          iVar44 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            i_00 = local_f40[(int)(local_f7c + 7)];
          }
          else if ((int)(local_f7c + 7) < (int)local_f2c) {
            in_stack_ffffffffffffead0 = local_f7c + 7;
            i_00 = in_stack_ffffffffffffead0;
          }
          else {
            in_stack_ffffffffffffead0 = local_f2c - 1;
            i_00 = in_stack_ffffffffffffead0;
          }
          lVar1 = lVar43 + (long)(iVar44 * i_00) * 4;
          local_8a0 = uVar36;
          uStack_898 = uVar37;
          uStack_890 = uVar38;
          uStack_888 = uVar39;
          local_8c0 = local_1140._0_8_;
          uStack_8b8 = local_1140._8_8_;
          uStack_8b0 = local_1140._16_8_;
          uStack_8a8 = local_1140._24_8_;
          auVar16._16_8_ = uVar38;
          auVar16._0_16_ = auVar13;
          auVar16._24_8_ = uVar39;
          auVar18 = vpcmpgtd_avx2(auVar16,local_1140);
          local_f80 = 0;
          while( true ) {
            auVar16 = local_1220;
            uStack_11e8 = auVar42._24_8_;
            uStack_11f0 = auVar42._16_8_;
            if ((int)(local_f14 + local_f24) <= (int)local_f80) break;
            local_560 = local_1220._0_8_;
            uStack_548 = local_1220._24_8_;
            local_e20 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffedd0),0xc);
            local_e40 = vpsrldq_avx2(_local_1240,4);
            auVar21 = vpor_avx2(local_e20,local_e40);
            local_1220._0_28_ = auVar21._0_28_;
            local_1220._28_4_ = local_f68[(int)local_f80];
            auVar23 = local_1220;
            local_e60 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffed90),0xc);
            local_e80 = vpsrldq_avx2(_local_1280,4);
            auVar22 = vpor_avx2(local_e60,local_e80);
            _local_1280 = auVar22._0_28_;
            uStack_1268._4_4_ = local_f70[(int)local_f80];
            auVar20 = _local_1280;
            local_1220._0_8_ = auVar21._0_8_;
            local_1220._8_8_ = auVar21._8_8_;
            local_1220._16_8_ = auVar21._16_8_;
            local_1220._24_8_ = auVar23._24_8_;
            local_620 = local_1220._0_8_;
            uStack_618 = local_1220._8_8_;
            uStack_610 = local_1220._16_8_;
            uStack_608 = local_1220._24_8_;
            local_640 = local_1080;
            uStack_638 = uStack_1078;
            uStack_630 = uStack_1070;
            uStack_628 = uStack_1068;
            auVar29._24_8_ = local_1220._24_8_;
            auVar29._0_24_ = auVar21._0_24_;
            auVar28._8_8_ = uStack_1078;
            auVar28._0_8_ = local_1080;
            auVar28._16_8_ = uStack_1070;
            auVar28._24_8_ = uStack_1068;
            local_720 = vpsubd_avx2(auVar29,auVar28);
            local_1280._0_8_ = auVar22._0_8_;
            local_1280._8_8_ = auVar22._8_8_;
            local_1280._16_8_ = auVar22._16_8_;
            uStack_1268 = auVar20._24_8_;
            local_660 = local_1280._0_8_;
            uStack_658 = local_1280._8_8_;
            uStack_650 = local_1280._16_8_;
            uStack_648 = uStack_1268;
            local_680 = local_10a0;
            uStack_678 = uStack_1098;
            uStack_670 = uStack_1090;
            uStack_668 = uStack_1088;
            auVar27._24_8_ = uStack_1268;
            auVar27._0_24_ = auVar22._0_24_;
            auVar19._8_8_ = uStack_1098;
            auVar19._0_8_ = local_10a0;
            auVar19._16_8_ = uStack_1090;
            auVar19._24_8_ = uStack_1088;
            local_740 = vpsubd_avx2(auVar27,auVar19);
            auVar21 = vpmaxsd_avx2(local_720,local_740);
            local_6a0 = local_1240._0_8_;
            uStack_698 = local_1240._8_8_;
            uStack_690 = local_1240._16_8_;
            uStack_688 = uStack_1228;
            local_6c0 = local_1080;
            uStack_6b8 = uStack_1078;
            uStack_6b0 = uStack_1070;
            uStack_6a8 = uStack_1068;
            auVar17._8_8_ = uStack_1078;
            auVar17._0_8_ = local_1080;
            auVar17._16_8_ = uStack_1070;
            auVar17._24_8_ = uStack_1068;
            local_760 = vpsubd_avx2(_local_1240,auVar17);
            local_6e0 = local_1260._0_8_;
            uStack_6d8 = local_1260._8_8_;
            uStack_6d0 = local_1260._16_8_;
            uStack_6c8 = local_1260._24_8_;
            local_700 = local_10a0;
            uStack_6f8 = uStack_1098;
            uStack_6f0 = uStack_1090;
            uStack_6e8 = uStack_1088;
            auVar22._8_8_ = uStack_1098;
            auVar22._0_8_ = local_10a0;
            auVar22._16_8_ = uStack_1090;
            auVar22._24_8_ = uStack_1088;
            local_780 = vpsubd_avx2(local_1260,auVar22);
            auVar22 = vpmaxsd_avx2(local_760,local_780);
            local_ac4 = *(undefined4 *)
                         (lVar7 + (long)(iVar2 * local_1484) * 4 +
                         (long)local_f60[(int)local_f80] * 4);
            local_ac8 = *(undefined4 *)
                         (lVar8 + (long)(iVar3 * local_149c) * 4 +
                         (long)local_f60[(int)(local_f80 - 1)] * 4);
            local_acc = *(undefined4 *)
                         (lVar9 + (long)(iVar4 * local_14b4) * 4 +
                         (long)local_f60[(int)(local_f80 - 2)] * 4);
            local_ad0 = *(uint *)(lVar10 + (long)(iVar5 * local_14cc) * 4 +
                                 (long)local_f60[(int)(local_f80 - 3)] * 4);
            local_ad4 = *(undefined4 *)
                         (lVar11 + (long)(iVar6 * local_14e4) * 4 +
                         (long)local_f60[(int)(local_f80 - 4)] * 4);
            local_ad8 = *(undefined4 *)
                         (lVar12 + (long)iVar41 * 4 + (long)local_f60[(int)(local_f80 - 5)] * 4);
            local_adc = *(undefined4 *)(lVar40 + (long)local_f60[(int)(local_f80 - 6)] * 4);
            local_ae0 = *(uint *)(lVar1 + (long)local_f60[(int)(local_f80 - 7)] * 4);
            auVar14 = vpinsrd_avx(ZEXT416(local_ae0),local_adc,1);
            auVar14 = vpinsrd_avx(auVar14,local_ad8,2);
            local_b00 = vpinsrd_avx(auVar14,local_ad4,3);
            auVar14 = vpinsrd_avx(ZEXT416(local_ad0),local_acc,1);
            auVar14 = vpinsrd_avx(auVar14,local_ac8,2);
            auStack_af0 = vpinsrd_avx(auVar14,local_ac4,3);
            uStack_1338 = auVar16._8_8_;
            uStack_1330 = auVar16._16_8_;
            uStack_558 = uStack_1338;
            uStack_550 = uStack_1330;
            local_580 = local_b00._0_8_;
            uStack_578 = local_b00._8_8_;
            uStack_570 = auStack_af0._0_8_;
            uStack_568 = auStack_af0._8_8_;
            auVar31._16_8_ = auStack_af0._0_8_;
            auVar31._0_16_ = local_b00;
            auVar31._24_8_ = auStack_af0._8_8_;
            auVar16 = vpaddd_avx2(auVar16,auVar31);
            local_1340 = auVar16._0_8_;
            uStack_1338 = auVar16._8_8_;
            uStack_1330 = auVar16._16_8_;
            uStack_1328 = auVar16._24_8_;
            local_1260._0_8_ = auVar22._0_8_;
            local_1260._8_8_ = auVar22._8_8_;
            local_1260._16_8_ = auVar22._16_8_;
            local_1260._24_8_ = auVar22._24_8_;
            local_7a0 = local_1340;
            uStack_798 = uStack_1338;
            uStack_790 = uStack_1330;
            uStack_788 = uStack_1328;
            local_7c0 = local_1260._0_8_;
            uStack_7b8 = local_1260._8_8_;
            uStack_7b0 = local_1260._16_8_;
            uStack_7a8 = local_1260._24_8_;
            auVar16 = vpmaxsd_avx2(auVar16,auVar22);
            local_1240._0_8_ = auVar16._0_8_;
            local_1240._8_8_ = auVar16._8_8_;
            local_1240._16_8_ = auVar16._16_8_;
            uStack_1228 = auVar16._24_8_;
            local_1280._0_8_ = auVar21._0_8_;
            local_1280._8_8_ = auVar21._8_8_;
            local_1280._16_8_ = auVar21._16_8_;
            uStack_1268 = auVar21._24_8_;
            local_7e0 = local_1240._0_8_;
            uStack_7d8 = local_1240._8_8_;
            uStack_7d0 = local_1240._16_8_;
            uStack_7c8 = uStack_1228;
            local_800 = local_1280._0_8_;
            uStack_7f8 = local_1280._8_8_;
            uStack_7f0 = local_1280._16_8_;
            uStack_7e8 = uStack_1268;
            auVar16 = vpmaxsd_avx2(auVar16,auVar21);
            local_1240._0_8_ = auVar16._0_8_;
            local_1240._8_8_ = auVar16._8_8_;
            local_1240._16_8_ = auVar16._16_8_;
            uStack_1228 = auVar16._24_8_;
            local_820 = local_1240._0_8_;
            uStack_818 = local_1240._8_8_;
            uStack_810 = local_1240._16_8_;
            uStack_808 = uStack_1228;
            local_840 = local_10c0;
            uStack_838 = uStack_10b8;
            uStack_830 = uStack_10b0;
            uStack_828 = uStack_10a8;
            auVar20._8_8_ = uStack_10b8;
            auVar20._0_8_ = local_10c0;
            auVar20._16_8_ = uStack_10b0;
            auVar20._24_8_ = uStack_10a8;
            auVar20 = vpmaxsd_avx2(auVar16,auVar20);
            local_4e0 = local_12a0._0_8_;
            uStack_4d8 = local_12a0._8_8_;
            uStack_4d0 = local_12a0._16_8_;
            uStack_4c8 = local_12a0._24_8_;
            local_500 = local_1120;
            uStack_4f8 = uStack_1118;
            uStack_4f0 = uStack_1110;
            uStack_4e8 = uStack_1108;
            auVar32._8_8_ = uStack_1118;
            auVar32._0_8_ = local_1120;
            auVar32._16_8_ = uStack_1110;
            auVar32._24_8_ = uStack_1108;
            local_4a0 = vpcmpeqd_avx2(local_12a0,auVar32);
            local_1240._0_8_ = auVar20._0_8_;
            local_1240._8_8_ = auVar20._8_8_;
            local_1240._16_8_ = auVar20._16_8_;
            uStack_1228 = auVar20._24_8_;
            local_4c0 = local_1240._0_8_;
            uStack_4b8 = local_1240._8_8_;
            uStack_4b0 = local_1240._16_8_;
            uStack_4a8 = uStack_1228;
            auVar16 = vpcmpeqd_avx2(local_4a0,local_4a0);
            _local_1240 = vpand_avx2(local_4a0 ^ auVar16,auVar20);
            local_1360 = local_4a0._0_8_;
            uStack_1358 = local_4a0._8_8_;
            uStack_1350 = local_4a0._16_8_;
            uStack_1348 = local_4a0._24_8_;
            local_200 = local_1280._0_8_;
            uStack_1f8 = local_1280._8_8_;
            uStack_1f0 = local_1280._16_8_;
            uStack_1e8 = uStack_1268;
            local_220 = local_1040;
            uStack_218 = uStack_1038;
            uStack_210 = uStack_1030;
            uStack_208 = uStack_1028;
            local_240 = local_1360;
            uStack_238 = uStack_1358;
            uStack_230 = uStack_1350;
            uStack_228 = uStack_1348;
            auVar34._8_8_ = uStack_1038;
            auVar34._0_8_ = local_1040;
            auVar34._16_8_ = uStack_1030;
            auVar34._24_8_ = uStack_1028;
            _local_1280 = vpblendvb_avx2(auVar21,auVar34,local_4a0);
            local_260 = local_1260._0_8_;
            uStack_258 = local_1260._8_8_;
            uStack_250 = local_1260._16_8_;
            uStack_248 = local_1260._24_8_;
            local_280 = local_1040;
            uStack_278 = uStack_1038;
            uStack_270 = uStack_1030;
            uStack_268 = uStack_1028;
            local_2a0 = local_1360;
            uStack_298 = uStack_1358;
            uStack_290 = uStack_1350;
            uStack_288 = uStack_1348;
            auVar33._8_8_ = uStack_1038;
            auVar33._0_8_ = local_1040;
            auVar33._16_8_ = uStack_1030;
            auVar33._24_8_ = uStack_1028;
            local_1260 = vpblendvb_avx2(auVar22,auVar33,local_4a0);
            uVar35 = local_1240._0_8_;
            if (local_f24 < (int)local_f80) {
              local_1c0 = local_1000._0_8_;
              uStack_1b8 = local_1000._8_8_;
              uStack_1b0 = local_1000._16_8_;
              uStack_1a8 = local_1000._24_8_;
              local_1e0 = local_1240._0_8_;
              uStack_1d8 = local_1240._8_8_;
              uStack_1d0 = local_1240._16_8_;
              uStack_1c8 = uStack_1228;
              local_1000 = vpminsd_avx2(local_1000,_local_1240);
              local_860 = local_1020._0_8_;
              uStack_858 = local_1020._8_8_;
              uStack_850 = local_1020._16_8_;
              uStack_848 = local_1020._24_8_;
              local_880 = local_1240._0_8_;
              uStack_878 = local_1240._8_8_;
              uStack_870 = local_1240._16_8_;
              uStack_868 = uStack_1228;
              local_1020 = vpmaxsd_avx2(local_1020,_local_1240);
            }
            vWH_00[1]._0_4_ = in_stack_ffffffffffffeae0;
            vWH_00[0] = lVar43;
            vWH_00[1]._4_4_ = iVar44;
            vWH_00[2]._0_4_ = in_stack_ffffffffffffeae8;
            vWH_00[2]._4_4_ = iVar45;
            vWH_00[3] = lVar46;
            arr_store_si256((int *)CONCAT44(iVar47,in_stack_ffffffffffffeb00),vWH_00,i_00,
                            in_stack_ffffffffffffead0,(int32_t)((ulong)local_f60 >> 0x20),
                            (int32_t)local_f60);
            local_f68[(int)(local_f80 - 7)] = local_1240._0_4_;
            local_f70[(int)(local_f80 - 7)] = local_1280._0_4_;
            local_8e0 = local_12a0._0_8_;
            uStack_8d8 = local_12a0._8_8_;
            uStack_8d0 = local_12a0._16_8_;
            uStack_8c8 = local_12a0._24_8_;
            local_900 = local_1120;
            uStack_8f8 = uStack_1118;
            uStack_8f0 = uStack_1110;
            uStack_8e8 = uStack_1108;
            auVar26._8_8_ = uStack_1118;
            auVar26._0_8_ = local_1120;
            auVar26._16_8_ = uStack_1110;
            auVar26._24_8_ = uStack_1108;
            local_80 = vpcmpgtd_avx2(local_12a0,auVar26);
            uStack_910 = uStack_11f0;
            uStack_908 = uStack_11e8;
            local_940 = local_12a0._0_8_;
            uStack_938 = local_12a0._8_8_;
            uStack_930 = local_12a0._16_8_;
            uStack_928 = local_12a0._24_8_;
            auVar25._16_8_ = uStack_11f0;
            auVar25._0_16_ = auVar42._0_16_;
            auVar25._24_8_ = uStack_11e8;
            local_a0 = vpcmpgtd_avx2(auVar25,local_12a0);
            auVar16 = vpand_avx2(local_80,local_a0);
            local_1380 = auVar16._0_8_;
            local_c0 = local_1380;
            uStack_1378 = auVar16._8_8_;
            uStack_b8 = uStack_1378;
            uStack_1370 = auVar16._16_8_;
            uStack_b0 = uStack_1370;
            uStack_1368 = auVar16._24_8_;
            uStack_a8 = uStack_1368;
            local_1300 = auVar18._0_8_;
            local_e0 = local_1300;
            uStack_12f8 = auVar18._8_8_;
            uStack_d8 = uStack_12f8;
            uStack_12f0 = auVar18._16_8_;
            uStack_d0 = uStack_12f0;
            uStack_12e8 = auVar18._24_8_;
            uStack_c8 = uStack_12e8;
            auVar16 = vpand_avx2(auVar16,auVar18);
            local_520 = uVar35;
            uStack_518 = local_1240._8_8_;
            uStack_510 = local_1240._16_8_;
            uStack_508 = uStack_1228;
            local_540 = local_1180._0_8_;
            uStack_538 = local_1180._8_8_;
            uStack_530 = local_1180._16_8_;
            uStack_528 = local_1180._24_8_;
            auVar17 = vpcmpeqd_avx2(_local_1240,local_1180);
            local_960 = uVar35;
            uStack_958 = local_1240._8_8_;
            uStack_950 = local_1240._16_8_;
            uStack_948 = uStack_1228;
            local_980 = local_1180._0_8_;
            uStack_978 = local_1180._8_8_;
            uStack_970 = local_1180._16_8_;
            uStack_968 = local_1180._24_8_;
            auVar21 = vpcmpgtd_avx2(_local_1240,local_1180);
            local_13e0 = auVar21._0_8_;
            local_100 = local_13e0;
            uStack_13d8 = auVar21._8_8_;
            uStack_f8 = uStack_13d8;
            uStack_13d0 = auVar21._16_8_;
            uStack_f0 = uStack_13d0;
            uStack_13c8 = auVar21._24_8_;
            uStack_e8 = uStack_13c8;
            local_13a0 = auVar16._0_8_;
            local_120 = local_13a0;
            uStack_1398 = auVar16._8_8_;
            uStack_118 = uStack_1398;
            uStack_1390 = auVar16._16_8_;
            uStack_110 = uStack_1390;
            uStack_1388 = auVar16._24_8_;
            uStack_108 = uStack_1388;
            auVar21 = vpand_avx2(auVar21,auVar16);
            local_9a0 = local_11c0._0_8_;
            uStack_998 = local_11c0._8_8_;
            uStack_990 = local_11c0._16_8_;
            uStack_988 = local_11c0._24_8_;
            local_9c0 = local_12a0._0_8_;
            uStack_9b8 = local_12a0._8_8_;
            uStack_9b0 = local_12a0._16_8_;
            uStack_9a8 = local_12a0._24_8_;
            auVar19 = vpcmpgtd_avx2(local_11c0,local_12a0);
            local_2c0 = local_1180._0_8_;
            uStack_2b8 = local_1180._8_8_;
            uStack_2b0 = local_1180._16_8_;
            uStack_2a8 = local_1180._24_8_;
            local_2e0 = uVar35;
            uStack_2d8 = local_1240._8_8_;
            uStack_2d0 = local_1240._16_8_;
            uStack_2c8 = uStack_1228;
            local_1400 = auVar21._0_8_;
            local_300 = local_1400;
            uStack_13f8 = auVar21._8_8_;
            uStack_2f8 = uStack_13f8;
            uStack_13f0 = auVar21._16_8_;
            uStack_2f0 = uStack_13f0;
            uStack_13e8 = auVar21._24_8_;
            uStack_2e8 = uStack_13e8;
            local_1180 = vpblendvb_avx2(local_1180,_local_1240,auVar21);
            local_320 = local_11a0._0_8_;
            uStack_318 = local_11a0._8_8_;
            uStack_310 = local_11a0._16_8_;
            uStack_308 = local_11a0._24_8_;
            local_340 = local_1140._0_8_;
            uStack_338 = local_1140._8_8_;
            uStack_330 = local_1140._16_8_;
            uStack_328 = local_1140._24_8_;
            local_360 = local_1400;
            uStack_358 = uStack_13f8;
            uStack_350 = uStack_13f0;
            uStack_348 = uStack_13e8;
            auVar22 = vpblendvb_avx2(local_11a0,local_1140,auVar21);
            local_380 = local_11c0._0_8_;
            uStack_378 = local_11c0._8_8_;
            uStack_370 = local_11c0._16_8_;
            uStack_368 = local_11c0._24_8_;
            local_3a0 = local_12a0._0_8_;
            uStack_398 = local_12a0._8_8_;
            uStack_390 = local_12a0._16_8_;
            uStack_388 = local_12a0._24_8_;
            local_3c0 = local_1400;
            uStack_3b8 = uStack_13f8;
            uStack_3b0 = uStack_13f0;
            uStack_3a8 = uStack_13e8;
            auVar20 = vpblendvb_avx2(local_11c0,local_12a0,auVar21);
            local_1420 = auVar19._0_8_;
            local_140 = local_1420;
            uStack_1418 = auVar19._8_8_;
            uStack_138 = uStack_1418;
            uStack_1410 = auVar19._16_8_;
            uStack_130 = uStack_1410;
            uStack_1408 = auVar19._24_8_;
            uStack_128 = uStack_1408;
            local_13c0 = auVar17._0_8_;
            local_160 = local_13c0;
            uStack_13b8 = auVar17._8_8_;
            uStack_158 = uStack_13b8;
            uStack_13b0 = auVar17._16_8_;
            uStack_150 = uStack_13b0;
            uStack_13a8 = auVar17._24_8_;
            uStack_148 = uStack_13a8;
            auVar21 = vpand_avx2(auVar19,auVar17);
            local_1400 = auVar21._0_8_;
            local_180 = local_1400;
            uStack_13f8 = auVar21._8_8_;
            uStack_178 = uStack_13f8;
            uStack_13f0 = auVar21._16_8_;
            uStack_170 = uStack_13f0;
            uStack_13e8 = auVar21._24_8_;
            uStack_168 = uStack_13e8;
            local_1a0 = local_13a0;
            uStack_198 = uStack_1398;
            uStack_190 = uStack_1390;
            uStack_188 = uStack_1388;
            auVar16 = vpand_avx2(auVar21,auVar16);
            local_11a0._0_8_ = auVar22._0_8_;
            local_3e0 = local_11a0._0_8_;
            local_11a0._8_8_ = auVar22._8_8_;
            uStack_3d8 = local_11a0._8_8_;
            local_11a0._16_8_ = auVar22._16_8_;
            uStack_3d0 = local_11a0._16_8_;
            local_11a0._24_8_ = auVar22._24_8_;
            uStack_3c8 = local_11a0._24_8_;
            local_400 = local_1140._0_8_;
            uStack_3f8 = local_1140._8_8_;
            uStack_3f0 = local_1140._16_8_;
            uStack_3e8 = local_1140._24_8_;
            local_1400 = auVar16._0_8_;
            local_420 = local_1400;
            uStack_13f8 = auVar16._8_8_;
            uStack_418 = uStack_13f8;
            uStack_13f0 = auVar16._16_8_;
            uStack_410 = uStack_13f0;
            uStack_13e8 = auVar16._24_8_;
            uStack_408 = uStack_13e8;
            local_11a0 = vpblendvb_avx2(auVar22,local_1140,auVar16);
            local_11c0._0_8_ = auVar20._0_8_;
            local_440 = local_11c0._0_8_;
            local_11c0._8_8_ = auVar20._8_8_;
            uStack_438 = local_11c0._8_8_;
            local_11c0._16_8_ = auVar20._16_8_;
            uStack_430 = local_11c0._16_8_;
            local_11c0._24_8_ = auVar20._24_8_;
            uStack_428 = local_11c0._24_8_;
            local_460 = local_12a0._0_8_;
            uStack_458 = local_12a0._8_8_;
            uStack_450 = local_12a0._16_8_;
            uStack_448 = local_12a0._24_8_;
            local_480 = local_1400;
            uStack_478 = uStack_13f8;
            uStack_470 = uStack_13f0;
            uStack_468 = uStack_13e8;
            local_11c0 = vpblendvb_avx2(auVar20,local_12a0,auVar16);
            local_5a0 = local_12a0._0_8_;
            uStack_598 = local_12a0._8_8_;
            uStack_590 = local_12a0._16_8_;
            uStack_588 = local_12a0._24_8_;
            local_5c0 = local_10e0;
            uStack_5b8 = uStack_10d8;
            uStack_5b0 = uStack_10d0;
            uStack_5a8 = uStack_10c8;
            auVar30._8_8_ = uStack_10d8;
            auVar30._0_8_ = local_10e0;
            auVar30._16_8_ = uStack_10d0;
            auVar30._24_8_ = uStack_10c8;
            local_12a0 = vpaddd_avx2(local_12a0,auVar30);
            local_f80 = local_f80 + 1;
            local_1220 = auVar23;
            local_920 = auVar42._0_16_;
          }
          local_5e0 = local_1140._0_8_;
          uStack_5d8 = local_1140._8_8_;
          uStack_5d0 = local_1140._16_8_;
          uStack_5c8 = local_1140._24_8_;
          local_600 = local_1100;
          uStack_5f8 = uStack_10f8;
          uStack_5f0 = uStack_10f0;
          uStack_5e8 = uStack_10e8;
          auVar21._8_8_ = uStack_10f8;
          auVar21._0_8_ = local_1100;
          auVar21._16_8_ = uStack_10f0;
          auVar21._24_8_ = uStack_10e8;
          local_1140 = vpaddd_avx2(local_1140,auVar21);
        }
        local_1428 = (uint *)local_1180;
        local_1430 = (int *)local_11a0;
        local_1438 = (int *)local_11c0;
        for (local_143c = 0; local_143c < local_f20; local_143c = local_143c + 1) {
          if ((int)local_f94 < (int)*local_1428) {
            local_f94 = *local_1428;
            local_f84 = *local_1430;
            local_f88 = *local_1438;
          }
          else if (*local_1428 == local_f94) {
            if (*local_1438 < local_f88) {
              local_f84 = *local_1430;
              local_f88 = *local_1438;
            }
            else if ((*local_1438 == local_f88) && (*local_1430 < local_f84)) {
              local_f84 = *local_1430;
              local_f88 = *local_1438;
            }
          }
          local_1428 = local_1428 + 1;
          local_1430 = local_1430 + 1;
          local_1438 = local_1438 + 1;
        }
        local_9e0 = local_fc0;
        uStack_9d8 = uStack_fb8;
        uStack_9d0 = uStack_fb0;
        uStack_9c8 = uStack_fa8;
        local_a00 = local_1000._0_8_;
        uStack_9f8 = local_1000._8_8_;
        uStack_9f0 = local_1000._16_8_;
        uStack_9e8 = local_1000._24_8_;
        auVar24._8_8_ = uStack_fb8;
        auVar24._0_8_ = local_fc0;
        auVar24._16_8_ = uStack_fb0;
        auVar24._24_8_ = uStack_fa8;
        local_ea0 = vpcmpgtd_avx2(auVar24,local_1000);
        local_a20 = local_1020._0_8_;
        uStack_a18 = local_1020._8_8_;
        uStack_a10 = local_1020._16_8_;
        uStack_a08 = local_1020._24_8_;
        local_a40 = local_fe0;
        uStack_a38 = uStack_fd8;
        uStack_a30 = uStack_fd0;
        uStack_a28 = uStack_fc8;
        auVar23._8_8_ = uStack_fd8;
        auVar23._0_8_ = local_fe0;
        auVar23._16_8_ = uStack_fd0;
        auVar23._24_8_ = uStack_fc8;
        local_ec0 = vpcmpgtd_avx2(local_1020,auVar23);
        local_60 = vpor_avx2(local_ea0,local_ec0);
        if ((((((((((((((((((((((((((((((((local_60 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_60 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_60 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_60 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_60 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_60 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_60 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_60 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_60 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_60 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_60 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_60 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_60 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_60 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_60 >> 0x7f,0) != '\0') ||
                          (local_60 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_60 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_60 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_60 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_60 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_60 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_60 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_60 >> 0xbf,0) != '\0') ||
                  (local_60 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_60 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_60 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_60 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_60 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_60 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_60 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_60[0x1f] < '\0') {
          local_f78->flag = local_f78->flag | 0x40;
          local_f94 = 0;
          local_f84 = 0;
          local_f88 = 0;
        }
        local_f78->score = local_f94;
        local_f78->end_query = local_f84;
        local_f78->end_ref = local_f88;
        parasail_free(local_f58);
        parasail_free(local_f50);
        parasail_free(local_f48);
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          parasail_free(local_f40);
        }
        local_ef8 = local_f78;
      }
    }
  }
  return local_ef8;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 4); /* shift in a 0 */
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vZero = _mm256_set1_epi32(0);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vJLimit = _mm256_set1_epi32(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m256i vIltLimit = _mm256_cmplt_epi32_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            vWH = _mm256_max_epi32(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi32(vJ, vNegOne),
                        _mm256_cmplt_epi32_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi32(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi32(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi32_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
    }

    /* alignment ending position */
    {
        int32_t *t = (int32_t*)&vMaxH;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}